

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O3

bool woff2::StoreGlyph(Glyph *glyph,uint8_t *dst,size_t *dst_size)

{
  int iVar1;
  pointer pvVar2;
  pointer pPVar3;
  ushort uVar4;
  int iVar5;
  vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_> *contour_1;
  long lVar6;
  ulong uVar7;
  pointer pvVar8;
  const_iterator __begin2;
  int iVar9;
  int iVar10;
  pointer pPVar11;
  Point *point;
  long lVar12;
  uint uVar13;
  uint8_t uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  
  uVar7 = (ulong)glyph->composite_data_size;
  if (uVar7 == 0) {
    pvVar8 = (glyph->contours).
             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (glyph->contours).
             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)pvVar2 - (long)pvVar8;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      uVar7 = lVar6 * -0x5555555555555555;
      if ((uVar7 < 0x8000) &&
         ((ulong)glyph->instructions_size + lVar6 * 0x5555555555555556 + 0xc <= *dst_size)) {
        uVar4 = (ushort)uVar7;
        *(ushort *)dst = uVar4 << 8 | uVar4 >> 8;
        *(ushort *)(dst + 2) = glyph->x_min << 8 | (ushort)glyph->x_min >> 8;
        *(ushort *)(dst + 4) = glyph->y_min << 8 | (ushort)glyph->y_min >> 8;
        *(ushort *)(dst + 6) = glyph->x_max << 8 | (ushort)glyph->x_max >> 8;
        *(ushort *)(dst + 8) = glyph->y_max << 8 | (ushort)glyph->y_max >> 8;
        lVar12 = -1;
        lVar6 = 0xc;
        do {
          lVar18 = lVar6;
          uVar7 = ((long)(pvVar8->
                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar8->
                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          iVar5 = 0;
          if ((0xffff < uVar7) ||
             (lVar12 = uVar7 + (long)(int)lVar12, iVar5 = 0, 0xffff < (int)lVar12))
          goto LAB_00108054;
          *(ushort *)(dst + lVar18 + -2) = (ushort)lVar12 << 8 | (ushort)lVar12 >> 8;
          pvVar8 = pvVar8 + 1;
          lVar6 = lVar18 + 2;
        } while (pvVar8 != pvVar2);
        *(uint16_t *)(dst + lVar18) = glyph->instructions_size << 8 | glyph->instructions_size >> 8;
        uVar4 = glyph->instructions_size;
        memcpy(dst + lVar6,glyph->instructions_data,(ulong)uVar4);
        uVar16 = (ulong)uVar4 + lVar6;
        uVar7 = *dst_size;
        pvVar8 = (glyph->contours).
                 super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (glyph->contours).
                 super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar5 = 0;
        if (pvVar8 == pvVar2) {
          lVar6 = 0;
          lVar12 = 0;
        }
        else {
          uVar15 = 0xffffffff;
          iVar9 = 0;
          iVar10 = 0;
          lVar12 = 0;
          lVar6 = 0;
          do {
            pPVar3 = (pvVar8->
                     super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pPVar11 = (pvVar8->
                           super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                           )._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar3;
                pPVar11 = pPVar11 + 1) {
              uVar13 = (uint)pPVar11->on_curve;
              iVar9 = pPVar11->x - iVar9;
              if (iVar9 == 0) {
                uVar13 = uVar13 | 0x10;
              }
              else if (iVar9 + 0xffU < 0x1ff) {
                uVar13 = uVar13 + (uint)(0 < iVar9) * 0x10 + 2;
                lVar12 = lVar12 + 1;
              }
              else {
                lVar12 = lVar12 + 2;
              }
              if (pPVar11->y == iVar10) {
                uVar13 = uVar13 | 0x20;
              }
              else {
                iVar10 = pPVar11->y - iVar10;
                if (iVar10 + 0xffU < 0x1ff) {
                  uVar13 = (uint)(0 < iVar10) << 5 | uVar13 | 4;
                  lVar6 = lVar6 + 1;
                }
                else {
                  lVar6 = lVar6 + 2;
                }
              }
              if (iVar5 == 0xff || uVar13 != uVar15) {
                if (iVar5 != 0) {
                  if (uVar7 <= uVar16) goto LAB_00108042;
                  dst[uVar16] = (uint8_t)iVar5;
                  uVar16 = uVar16 + 1;
                }
                iVar5 = 0;
                if (uVar7 <= uVar16) goto LAB_00108054;
                dst[uVar16] = (uint8_t)uVar13;
                uVar16 = uVar16 + 1;
              }
              else {
                dst[uVar16 - 1] = dst[uVar16 - 1] | 8;
                iVar5 = iVar5 + 1;
              }
              iVar9 = pPVar11->x;
              iVar10 = pPVar11->y;
              uVar15 = uVar13;
            }
            pvVar8 = pvVar8 + 1;
          } while (pvVar8 != pvVar2);
          if (iVar5 != 0) {
            if (uVar7 <= uVar16) goto LAB_00108042;
            dst[uVar16] = (uint8_t)iVar5;
            uVar16 = uVar16 + 1;
          }
        }
        sVar17 = lVar12 + uVar16;
        if (lVar6 + sVar17 <= uVar7) {
          pvVar8 = (glyph->contours).
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = (glyph->contours).
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar8 != pvVar2) {
            iVar9 = 0;
            iVar5 = 0;
            do {
              pPVar3 = (pvVar8->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pPVar11 = (pvVar8->
                             super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                             )._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar3;
                  pPVar11 = pPVar11 + 1) {
                iVar10 = pPVar11->x;
                iVar1 = pPVar11->y;
                iVar9 = iVar10 - iVar9;
                if (iVar9 != 0) {
                  if (iVar9 + 0xffU < 0x1ff) {
                    uVar14 = -(uint8_t)iVar9;
                    if (0 < iVar9) {
                      uVar14 = (uint8_t)iVar9;
                    }
                    dst[uVar16] = uVar14;
                    uVar16 = uVar16 + 1;
                  }
                  else {
                    *(ushort *)(dst + uVar16) = (ushort)iVar9 << 8 | (ushort)iVar9 >> 8;
                    uVar16 = uVar16 + 2;
                  }
                }
                if (iVar1 != iVar5) {
                  iVar5 = iVar1 - iVar5;
                  if (iVar5 + 0xffU < 0x1ff) {
                    uVar14 = -(uint8_t)iVar5;
                    if (0 < iVar5) {
                      uVar14 = (uint8_t)iVar5;
                    }
                    dst[sVar17] = uVar14;
                    sVar17 = sVar17 + 1;
                  }
                  else {
                    *(ushort *)(dst + sVar17) = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
                    sVar17 = sVar17 + 2;
                  }
                }
                iVar5 = iVar1;
                iVar9 = iVar10;
              }
              pvVar8 = pvVar8 + 1;
            } while (pvVar8 != pvVar2);
          }
          goto LAB_0010804f;
        }
      }
LAB_00108042:
      iVar5 = 0;
      goto LAB_00108054;
    }
    sVar17 = 0;
  }
  else {
    if (*dst_size < glyph->instructions_size + uVar7 + 10 + (ulong)glyph->have_instructions * 2)
    goto LAB_00108042;
    dst[0] = 0xff;
    dst[1] = 0xff;
    *(ushort *)(dst + 2) = glyph->x_min << 8 | (ushort)glyph->x_min >> 8;
    *(ushort *)(dst + 4) = glyph->y_min << 8 | (ushort)glyph->y_min >> 8;
    *(ushort *)(dst + 6) = glyph->x_max << 8 | (ushort)glyph->x_max >> 8;
    *(ushort *)(dst + 8) = glyph->y_max << 8 | (ushort)glyph->y_max >> 8;
    memcpy(dst + 10,glyph->composite_data,uVar7);
    if (glyph->have_instructions == true) {
      *(uint16_t *)(dst + uVar7 + 10) =
           glyph->instructions_size << 8 | glyph->instructions_size >> 8;
      uVar4 = glyph->instructions_size;
      memcpy(dst + uVar7 + 0xc,glyph->instructions_data,(ulong)uVar4);
      sVar17 = uVar7 + uVar4 + 0xc;
    }
    else {
      sVar17 = uVar7 + 10;
    }
  }
LAB_0010804f:
  *dst_size = sVar17;
  iVar5 = 1;
LAB_00108054:
  return SUB41(iVar5,0);
}

Assistant:

bool StoreGlyph(const Glyph& glyph, uint8_t* dst, size_t* dst_size) {
  size_t offset = 0;
  if (glyph.composite_data_size > 0) {
    // Composite glyph.
    if (*dst_size < ((10ULL + glyph.composite_data_size) +
                     ((glyph.have_instructions ? 2ULL : 0) +
                      glyph.instructions_size))) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(-1, &offset, dst);
    StoreBbox(glyph, &offset, dst);
    StoreBytes(glyph.composite_data, glyph.composite_data_size, &offset, dst);
    if (glyph.have_instructions) {
      StoreInstructions(glyph, &offset, dst);
    }
  } else if (glyph.contours.size() > 0) {
    // Simple glyph.
    if (glyph.contours.size() > std::numeric_limits<int16_t>::max()) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (*dst_size < ((12ULL + 2 * glyph.contours.size()) +
                     glyph.instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(glyph.contours.size(), &offset, dst);
    StoreBbox(glyph, &offset, dst);
    if (!StoreEndPtsOfContours(glyph, &offset, dst)) {
      return FONT_COMPRESSION_FAILURE();
    }
    StoreInstructions(glyph, &offset, dst);
    if (!StorePoints(glyph, &offset, dst, *dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  *dst_size = offset;
  return true;
}